

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

size_t xm_get_memory_needed_for_context(char *moddata,size_t moddata_length)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ushort uVar6;
  short sVar7;
  uint uVar8;
  ushort uVar9;
  short sVar10;
  long lVar11;
  ushort uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  
  if (moddata_length < 0x45) {
    if (0x40 < moddata_length) {
      bVar1 = moddata[0x40];
      uVar6 = 0;
      uVar12 = 0;
      uVar9 = 0;
      sVar7 = 0;
      lVar5 = 0;
      iVar4 = 0;
      lVar11 = 0;
      sVar10 = 0;
      if (moddata_length != 0x41) goto LAB_00103104;
      goto LAB_00103114;
    }
    if (moddata_length < 0x3f) {
      uVar6 = 0;
      lVar5 = 0;
      goto LAB_00103372;
    }
    lVar5 = 0;
    uVar6 = 0;
    if (moddata_length != 0x40) goto LAB_00103372;
    uVar6 = 0;
    uVar12 = *(ushort *)(moddata + 0x3c);
    uVar9 = 0;
    sVar7 = 0;
  }
  else {
    uVar6 = (ushort)(byte)moddata[0x44];
    if (moddata_length == 0x45) {
LAB_001030ed:
      uVar12 = 0;
LAB_001030f0:
      lVar11 = (ulong)uVar12 << 4;
LAB_001030fd:
      uVar14 = 0;
    }
    else {
      uVar6 = CONCAT11(moddata[0x45],moddata[0x44]);
      if (moddata_length < 0x47) goto LAB_001030ed;
      uVar12 = (ushort)(byte)moddata[0x46];
      if (moddata_length == 0x47) goto LAB_001030f0;
      uVar12 = CONCAT11(moddata[0x47],moddata[0x46]);
      lVar11 = (ulong)uVar12 * 0x10;
      if (moddata_length < 0x49) goto LAB_001030fd;
      if (moddata_length == 0x49) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ushort)(byte)moddata[0x49] << 8;
      }
      uVar14 = (ulong)uVar9 | (ulong)(byte)moddata[0x48];
      lVar11 = lVar11 + uVar14 * 0xf8;
    }
    bVar1 = moddata[0x40];
    sVar10 = (short)uVar14;
LAB_00103104:
    sVar7 = sVar10;
    lVar5 = lVar11;
    iVar4 = (uint)(byte)moddata[0x41] << 8;
    uVar9 = uVar12;
LAB_00103114:
    lVar5 = (ulong)((iVar4 + (uint)bVar1) * 0x100) + lVar5;
    uVar12 = *(ushort *)(moddata + 0x3c);
  }
  uVar14 = (ulong)((uint)(byte)moddata[0x3e] << 0x10 | (uint)(byte)moddata[0x3f] << 0x18) +
           (ulong)uVar12 + 0x3c;
  if (uVar9 != 0) {
    do {
      if (uVar14 + 5 < moddata_length) {
        uVar3 = (ulong)(byte)moddata[uVar14 + 5];
      }
      else {
        uVar3 = 0;
      }
      if (uVar14 + 6 < moddata_length) {
        uVar17 = (ulong)(byte)moddata[uVar14 + 6] << 8;
      }
      else {
        uVar17 = 0;
      }
      if (uVar14 < moddata_length) {
        uVar13 = (uint)(byte)moddata[uVar14];
      }
      else {
        uVar13 = 0;
      }
      if (uVar14 + 1 < moddata_length) {
        uVar8 = (uint)(byte)moddata[uVar14 + 1] << 8;
      }
      else {
        uVar8 = 0;
      }
      if (uVar14 + 2 < moddata_length) {
        uVar16 = (uint)(byte)moddata[uVar14 + 2];
      }
      else {
        uVar16 = 0;
      }
      if (uVar14 + 3 < moddata_length) {
        uVar2 = (uint)(byte)moddata[uVar14 + 3] << 8;
      }
      else {
        uVar2 = 0;
      }
      if (uVar14 + 7 < moddata_length) {
        uVar18 = (uint)(byte)moddata[uVar14 + 7];
      }
      else {
        uVar18 = 0;
      }
      if (uVar14 + 8 < moddata_length) {
        iVar4 = (uint)(byte)moddata[uVar14 + 8] << 8;
      }
      else {
        iVar4 = 0;
      }
      lVar5 = lVar5 + (uVar17 | uVar3) * (ulong)uVar6 * 5;
      uVar14 = (iVar4 + uVar18 + ((uVar2 | uVar16) << 0x10 | uVar8 | uVar13)) + uVar14;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if (sVar7 != 0) {
    sVar10 = 0;
    do {
      if (uVar14 + 0x1b < moddata_length) {
        uVar12 = (ushort)(byte)moddata[uVar14 + 0x1b];
      }
      else {
        uVar12 = 0;
      }
      uVar8 = 0;
      uVar13 = 0;
      if (uVar14 + 0x1c < moddata_length) {
        uVar13 = (uint)(byte)moddata[uVar14 + 0x1c] << 8;
      }
      if (uVar14 < moddata_length) {
        uVar8 = (uint)(byte)moddata[uVar14];
      }
      uVar16 = 0;
      uVar2 = 0;
      if (uVar14 + 1 < moddata_length) {
        uVar2 = (uint)(byte)moddata[uVar14 + 1] << 8;
      }
      if (uVar14 + 2 < moddata_length) {
        uVar16 = (uint)(byte)moddata[uVar14 + 2];
      }
      uVar18 = 0;
      if (uVar14 + 3 < moddata_length) {
        uVar18 = (uint)(byte)moddata[uVar14 + 3] << 8;
      }
      lVar5 = lVar5 + (ulong)(uVar13 | uVar12) * 0x38;
      uVar18 = (uVar18 | uVar16) * 0x10000;
      uVar16 = uVar2 | uVar8 | uVar18;
      if (((uVar2 | uVar8) + uVar18) - 0x108 < 0xfffffef9) {
        uVar16 = 0x107;
      }
      uVar14 = uVar14 + uVar16;
      if ((short)uVar13 == 0 && uVar12 == 0) {
        uVar3 = 0;
      }
      else {
        uVar13 = uVar12 + uVar13;
        uVar8 = 0;
        do {
          uVar3 = uVar14;
          uVar16 = 0;
          if (uVar3 < moddata_length) {
            uVar16 = (uint)(byte)moddata[uVar3];
          }
          uVar18 = 0;
          uVar2 = 0;
          if (uVar3 + 1 < moddata_length) {
            uVar2 = (uint)(byte)moddata[uVar3 + 1] << 8;
          }
          if (uVar3 + 2 < moddata_length) {
            uVar18 = (uint)(byte)moddata[uVar3 + 2];
          }
          uVar15 = 0;
          if (uVar3 + 3 < moddata_length) {
            uVar15 = (uint)(byte)moddata[uVar3 + 3] << 8;
          }
          uVar16 = (uVar15 | uVar18) << 0x10 | uVar2 | uVar16;
          uVar8 = uVar8 + uVar16;
          lVar5 = lVar5 + (ulong)uVar16;
          uVar12 = (short)uVar13 - 1;
          uVar13 = (uint)uVar12;
          uVar14 = uVar3 + 0x28;
        } while (uVar12 != 0);
        uVar14 = uVar3 + 0x28;
        uVar3 = (ulong)uVar8;
      }
      uVar14 = uVar14 + uVar3;
      sVar10 = sVar10 + 1;
    } while (sVar10 != sVar7);
  }
LAB_00103372:
  return (ulong)uVar6 * 0x138 + lVar5 + 0x170;
}

Assistant:

size_t xm_get_memory_needed_for_context(const char* moddata, size_t moddata_length) {
	size_t memory_needed = 0;
	size_t offset = 60; /* Skip the first header */
	uint16_t num_channels;
	uint16_t num_patterns;
	uint16_t num_instruments;

	/* Read the module header */

	num_channels = READ_U16(offset + 8);
	num_patterns = READ_U16(offset + 10);
	memory_needed += num_patterns * sizeof(xm_pattern_t);

	num_instruments = READ_U16(offset + 12);
	memory_needed += num_instruments * sizeof(xm_instrument_t);

	memory_needed += MAX_NUM_ROWS * READ_U16(offset + 4) * sizeof(uint8_t); /* Module length */

	/* Header size */
	offset += READ_U32(offset);

	/* Read pattern headers */
	for(uint16_t i = 0; i < num_patterns; ++i) {
		uint16_t num_rows;

		num_rows = READ_U16(offset + 5);
		memory_needed += num_rows * num_channels * sizeof(xm_pattern_slot_t);

		/* Pattern header length + packed pattern data size */
		offset += READ_U32(offset) + READ_U16(offset + 7);
	}

	/* Read instrument headers */
	for(uint16_t i = 0; i < num_instruments; ++i) {
		uint16_t num_samples;
		uint32_t sample_size_aggregate = 0;

		num_samples = READ_U16(offset + 27);
		memory_needed += num_samples * sizeof(xm_sample_t);

		/* Instrument header size */
		uint32_t ins_header_size = READ_U32(offset);
		if (ins_header_size == 0 || ins_header_size > INSTRUMENT_HEADER_LENGTH)
			ins_header_size = INSTRUMENT_HEADER_LENGTH;
		offset += ins_header_size;

		for(uint16_t j = 0; j < num_samples; ++j) {
			uint32_t sample_size;

			sample_size = READ_U32(offset);
			sample_size_aggregate += sample_size;
			memory_needed += sample_size;
			offset += 40; /* See comment in xm_load_module() */
		}

		offset += sample_size_aggregate;
	}

	memory_needed += num_channels * sizeof(xm_channel_context_t);
	memory_needed += sizeof(xm_context_t);

	return memory_needed;
}